

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)21>_> *
vkt::shaderexecutor::anon_unknown_0::createDummyDescriptorPool
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device)

{
  undefined1 local_50 [8];
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolSize dummySize;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  createInfo.pPoolSizes = (VkDescriptorPoolSize *)0x100000006;
  local_50._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 1;
  createInfo.pNext._4_4_ = 1;
  createInfo.flags = 1;
  createInfo._24_8_ = &createInfo.pPoolSizes;
  ::vk::createDescriptorPool
            (__return_storage_ptr__,vkd,device,(VkDescriptorPoolCreateInfo *)local_50,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorPool> createDummyDescriptorPool (const DeviceInterface& vkd, VkDevice device)
{
	const VkDescriptorPoolSize			dummySize	=
	{
		VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
		1u,
	};
	const VkDescriptorPoolCreateInfo	createInfo	=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
		DE_NULL,
		(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
		1u,
		1u,
		&dummySize
	};
	return createDescriptorPool(vkd, device, &createInfo);
}